

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ShaderSharingTest::createResource(GLES2ShaderSharingTest *this)

{
  ostringstream *poVar1;
  GLuint GVar2;
  GLenum GVar3;
  TestError *this_00;
  int line;
  char *msg;
  char *fragmentShader;
  char *vertexShader;
  GLint status;
  MessageBuilder local_298;
  char buffer [256];
  
  vertexShader = 
  "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
  ;
  fragmentShader =
       "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}\n";
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.createShader)(this->m_shaderType);
  this->m_shader = GVar2;
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"glCreateShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x338);
  if (this->m_shaderType == 0x8b30) {
    (*(this->super_GLES2SharingTest).m_gl.shaderSource)
              (this->m_shader,1,&fragmentShader,(GLint *)0x0);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    msg = "shaderSource(m_shader, 1, &fragmentShader, DE_NULL)";
    line = 0x341;
LAB_001dc4c5:
    glu::checkError(GVar3,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,line);
  }
  else if (this->m_shaderType == 0x8b31) {
    (*(this->super_GLES2SharingTest).m_gl.shaderSource)(this->m_shader,1,&vertexShader,(GLint *)0x0)
    ;
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    msg = "shaderSource(m_shader, 1, &vertexShader, DE_NULL)";
    line = 0x33d;
    goto LAB_001dc4c5;
  }
  (*(this->super_GLES2SharingTest).m_gl.compileShader)(this->m_shader);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"compileShader(m_shader)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x348);
  status = 0;
  (*(this->super_GLES2SharingTest).m_gl.getShaderiv)(this->m_shader,0x8b81,&status);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"getShaderiv(m_shader, GL_COMPILE_STATUS, &status)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x34b);
  if (status != 0) {
    return;
  }
  (*(this->super_GLES2SharingTest).m_gl.getShaderInfoLog)
            (this->m_shader,0x100,(GLsizei *)0x0,buffer);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"getShaderInfoLog(m_shader, 256, DE_NULL, buffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x350);
  local_298.m_log = (this->super_GLES2SharingTest).m_log;
  poVar1 = &local_298.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Failed to compile shader");
  tcu::MessageBuilder::operator<<(&local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (this->m_shaderType == 0x8b30) {
    local_298.m_log = (this->super_GLES2SharingTest).m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_298.m_str);
    std::operator<<((ostream *)&local_298.m_str,fragmentShader);
    tcu::MessageBuilder::operator<<(&local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (this->m_shaderType != 0x8b31) goto LAB_001dc64a;
    local_298.m_log = (this->super_GLES2SharingTest).m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_298.m_str);
    std::operator<<((ostream *)&local_298.m_str,vertexShader);
    tcu::MessageBuilder::operator<<(&local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_298.m_str);
LAB_001dc64a:
  local_298.m_log = (this->super_GLES2SharingTest).m_log;
  poVar1 = &local_298.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,buffer);
  tcu::MessageBuilder::operator<<(&local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to compile shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x363);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2ShaderSharingTest::createResource (void)
{
	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec4 a_color;\n"
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = v_color;\n"
	"}\n";


	m_shader = m_gl.createShader(m_shaderType);
	GLU_CHECK_GLW_MSG(m_gl, "glCreateShader()");

	switch (m_shaderType)
	{
		case GL_VERTEX_SHADER:
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(m_shader, 1, &vertexShader, DE_NULL));
			break;

		case GL_FRAGMENT_SHADER:
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(m_shader, 1, &fragmentShader, DE_NULL));
			break;

		default:
			DE_ASSERT(false);
	}

	GLU_CHECK_GLW_CALL(m_gl, compileShader(m_shader));

	GLint status = 0;
	GLU_CHECK_GLW_CALL(m_gl, getShaderiv(m_shader, GL_COMPILE_STATUS, &status));

	if (!status)
	{
		char buffer[256];
		GLU_CHECK_GLW_CALL(m_gl, getShaderInfoLog(m_shader, 256, DE_NULL, buffer));

		m_log << tcu::TestLog::Message << "Failed to compile shader" << tcu::TestLog::EndMessage;

		switch (m_shaderType)
		{
			case GL_VERTEX_SHADER:
				m_log << tcu::TestLog::Message << vertexShader << tcu::TestLog::EndMessage;
				break;

			case GL_FRAGMENT_SHADER:
				m_log << tcu::TestLog::Message << fragmentShader << tcu::TestLog::EndMessage;
				break;

			default:
				DE_ASSERT(false);
		}

		m_log << tcu::TestLog::Message << buffer << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to compile shader");
	}
}